

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void Assimp::ColladaParser::ToCamelCase(string *text)

{
  iterator iVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  reference pcVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  char *local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  iterator it;
  string *text_local;
  
  it._M_current = (char *)text;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar5 = (char *)std::__cxx11::string::operator[](it._M_current);
    cVar2 = ToUpper<char>(*pcVar5);
    pcVar5 = (char *)std::__cxx11::string::operator[](it._M_current);
    *pcVar5 = cVar2;
    local_18._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_20._M_current = (char *)std::__cxx11::string::end();
      bVar3 = __gnu_cxx::operator!=(&local_18,&local_20);
      if (!bVar3) break;
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_18);
      iVar1 = it;
      if (*pcVar6 == '_') {
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_18);
        local_28 = (char *)std::__cxx11::string::erase(iVar1._M_current,local_30);
        local_18._M_current = local_28;
        local_38._M_current = (char *)std::__cxx11::string::end();
        bVar3 = __gnu_cxx::operator!=(&local_18,&local_38);
        if (bVar3) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_18);
          cVar2 = ToUpper<char>(*pcVar6);
          pcVar6 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_18);
          *pcVar6 = cVar2;
        }
      }
      else {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_18);
      }
    }
  }
  return;
}

Assistant:

void ColladaParser::ToCamelCase(std::string &text)
{
    if (text.empty())
        return;
    // Capitalise first character
    text[0] = ToUpper(text[0]);
    for (auto it = text.begin(); it != text.end(); /*iterated below*/)
    {
        if ((*it) == '_')
        {
            it = text.erase(it);
            if (it != text.end())
                (*it) = ToUpper(*it);
        }
        else
            ++it;
    }
}